

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadMemLocation
          (BinaryReader *this,Address *alignment_log2,Index *memidx,Address *offset,char *desc_align
          ,char *desc_memidx,char *desc_offset,uint8_t *lane_val)

{
  pointer pLVar1;
  Result RVar2;
  undefined8 in_RAX;
  Enum EVar3;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  RVar2 = ReadAlignment(this,alignment_log2,desc_align);
  EVar3 = Error;
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  *memidx = 0;
  if (0x3f < *alignment_log2) {
    if ((this->options_->features).multi_memory_enabled_ == false) {
      PrintError(this,"multi_memory not allowed");
      return (Result)Error;
    }
    *alignment_log2 = (ulong)((uint)*alignment_log2 & 0x3f);
    RVar2 = ReadMemidx(this,memidx,desc_memidx);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
  }
  pLVar1 = (this->memories).super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->memories).super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
      super__Vector_impl_data._M_finish == pLVar1) {
    PrintError(this,"load/store memory %u out of range %zu",0,0);
    RVar2.enum_ = Error;
  }
  else if (pLVar1->is_64 == true) {
    RVar2 = ReadU64Leb128(this,offset,desc_offset);
  }
  else {
    RVar2 = ReadU32Leb128(this,&local_34,desc_offset);
    *offset = (ulong)local_34;
  }
  if ((RVar2.enum_ != Error) &&
     ((lane_val == (uint8_t *)0x0 ||
      (RVar2 = ReadU8(this,lane_val,"Lane idx"), RVar2.enum_ != Error)))) {
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReader::ReadMemLocation(Address* alignment_log2,
                                     Index* memidx,
                                     Address* offset,
                                     const char* desc_align,
                                     const char* desc_memidx,
                                     const char* desc_offset,
                                     uint8_t* lane_val) {
  CHECK_RESULT(ReadAlignment(alignment_log2, desc_align));
  *memidx = 0;
  if (*alignment_log2 >> 6) {
    ERROR_IF(!options_.features.multi_memory_enabled(),
             "multi_memory not allowed");
    *alignment_log2 = *alignment_log2 & ((1 << 6) - 1);
    CHECK_RESULT(ReadMemidx(memidx, desc_memidx));
  }
  CHECK_RESULT(ReadAddress(offset, 0, desc_offset));

  if (lane_val) {
    CHECK_RESULT(ReadU8(lane_val, "Lane idx"));
  }

  return Result::Ok;
}